

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostringstream *s,TLLSignature sig)

{
  Snapshot snapshot;
  ostream *poVar1;
  char *pcVar2;
  pointer ppVar3;
  cmOutputConverter converter;
  cmListFileContext lfc;
  undefined8 local_68;
  undefined8 uStack_60;
  PositionType local_58;
  string local_50;
  
  pcVar2 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar2 = "keyword";
  }
  poVar1 = std::operator<<((ostream *)s,"The uses of the ");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," signature are here:\n");
  cmMakefile::GetStateSnapshot(this->Makefile);
  snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_60;
  snapshot.State = (cmState *)local_68;
  snapshot.Position.Position = local_58;
  cmOutputConverter::cmOutputConverter(&converter,snapshot);
  for (ppVar3 = (this->TLLCommands).
                super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (this->TLLCommands).
                super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    if (ppVar3->first == sig) {
      cmListFileContext::cmListFileContext(&lfc,&ppVar3->second);
      cmOutputConverter::Convert(&local_50,&converter,&lfc.FilePath,HOME,UNCHANGED);
      std::__cxx11::string::operator=((string *)&lfc.FilePath,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      poVar1 = std::operator<<((ostream *)s," * ");
      poVar1 = operator<<(poVar1,&lfc);
      std::endl<char,std::char_traits<char>>(poVar1);
      cmListFileContext::~cmListFileContext(&lfc);
    }
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostringstream &s,
                                     TLLSignature sig) const
{
  const char *sigString = (sig == cmTarget::KeywordTLLSignature ? "keyword"
                                                                : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  typedef std::vector<std::pair<TLLSignature, cmListFileContext> > Container;
  cmOutputConverter converter(this->GetMakefile()->GetStateSnapshot());
  for(Container::const_iterator it = this->TLLCommands.begin();
      it != this->TLLCommands.end(); ++it)
    {
    if (it->first == sig)
      {
      cmListFileContext lfc = it->second;
      lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
      s << " * " << lfc << std::endl;
      }
    }
}